

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::DeleteFace(dgPolyhedra *this,dgEdge *face)

{
  uint uVar1;
  dgEdge *pdVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  dgEdge *edgeList [16384];
  long alStack_20018 [16384];
  
  if (0 < face->m_incidentFace) {
    uVar1 = 0;
    pdVar2 = face;
    do {
      pdVar2->m_incidentFace = -1;
      uVar3 = ~((int)uVar1 >> 0x1f) & uVar1;
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        if (((dgEdge *)alStack_20018[uVar5] == pdVar2) ||
           (((dgEdge *)alStack_20018[uVar5])->m_twin == pdVar2)) {
          uVar3 = (uint)uVar5;
          break;
        }
      }
      if (uVar3 == uVar1) {
        lVar4 = (long)(int)uVar1;
        uVar1 = uVar1 + 1;
        alStack_20018[lVar4] = (long)pdVar2;
      }
      pdVar2 = pdVar2->m_next;
    } while (pdVar2 != face);
    for (uVar5 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
      if (((dgEdge *)alStack_20018[uVar5])->m_twin->m_incidentFace < 0) {
        DeleteEdge(this,(dgEdge *)alStack_20018[uVar5]);
      }
    }
  }
  return;
}

Assistant:

void dgPolyhedra::DeleteFace(dgEdge* const face)
{
	dgEdge* edgeList[1024 * 16];

	if (face->m_incidentFace > 0) {
		hacd::HaI32 count = 0;
		dgEdge* ptr = face;
		do {
			ptr->m_incidentFace = -1;
			hacd::HaI32 i = 0;
			for (; i < count; i ++) {
				if ((edgeList[i] == ptr) || (edgeList[i]->m_twin == ptr)) {
					break;
				}
			}
			if (i == count) {
				edgeList[count] = ptr;
				count ++;
			}
			ptr = ptr->m_next;
		} while (ptr != face);


		for (hacd::HaI32 i = 0; i < count; i ++) {
			dgEdge* const ptr = edgeList[i];
			if (ptr->m_twin->m_incidentFace < 0) {
				DeleteEdge (ptr);
			}
		}
	}
}